

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  DataDeclarationSyntax *args_2;
  CheckerDataDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = (DataDeclarationSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),&local_31,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerDataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataDeclarationSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_30,args_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerDataDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerDataDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.rand.deepClone(alloc),
        *deepClone<DataDeclarationSyntax>(*node.data, alloc)
    );
}